

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compile_compute_shader(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_2b9;
  string local_2b8;
  char *local_298;
  char *computeShaderSource_12;
  string local_288;
  char *local_268;
  char *computeShaderSource_11;
  string local_258;
  char *local_238;
  char *computeShaderSource_10;
  string local_228;
  char *local_208;
  char *computeShaderSource_9;
  string local_1f8;
  char *local_1d8;
  char *computeShaderSource_8;
  string local_1c8;
  char *local_1a8;
  char *computeShaderSource_7;
  string local_198;
  char *local_178;
  char *computeShaderSource_6;
  string local_168;
  char *local_148;
  char *computeShaderSource_5;
  string local_138;
  char *local_118;
  char *computeShaderSource_4;
  string local_108;
  char *local_e8;
  char *computeShaderSource_3;
  string local_d8;
  char *local_b8;
  char *computeShaderSource_2;
  string local_a8;
  char *local_88;
  char *computeShaderSource_1;
  string local_78;
  char *local_58;
  char *computeShaderSource;
  allocator<char> local_39;
  string local_38;
  int local_14;
  NegativeTestContext *pNStack_10;
  GLint compileStatus;
  NegativeTestContext *ctx_local;
  
  pNStack_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Compile Computer Shader",&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_58 = "#version 300 es\nvoid main (void)\n{\n}\n";
  compile_compute_shader_helper(pNStack_10,&local_58,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Compute Shader should not have compiled with #version 300 es.",
               (allocator<char> *)((long)&computeShaderSource_1 + 7));
    NegativeTestContext::fail(pNVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_1 + 7));
  }
  local_88 = "#version 310 es\nbuffer SSBO { vec4 data }void main (void)\n{\n}\n";
  compile_compute_shader_helper(pNStack_10,&local_88,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Compute Shader should not have compiled: incorrect SSBO syntax."
               ,(allocator<char> *)((long)&computeShaderSource_2 + 7));
    NegativeTestContext::fail(pNVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_2 + 7));
  }
  local_b8 = "#version 310 es\nbuffer SSBO { vec4 data;};uniform mat4 data;void main (void)\n{\n}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_b8,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "Compute Shader should not have compiled: buffer variable redefinition.",
               (allocator<char> *)((long)&computeShaderSource_3 + 7));
    NegativeTestContext::fail(pNVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_3 + 7));
  }
  local_e8 = "#version 310 es\nbuffer SSBO { vec4 data[]; vec4 moreData;};void main (void)\n{\n}\n";
  compile_compute_shader_helper(pNStack_10,&local_e8,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "Compute Shader should not have compiled: unspecified length buffer member not at the end."
               ,(allocator<char> *)((long)&computeShaderSource_4 + 7));
    NegativeTestContext::fail(pNVar1,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_4 + 7));
  }
  local_118 = "#version 310 es\nin vec4 data;void main (void)\n{\n}\n";
  compile_compute_shader_helper(pNStack_10,&local_118,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Compute Shader should not have compiled: input qualifier used."
               ,(allocator<char> *)((long)&computeShaderSource_5 + 7));
    NegativeTestContext::fail(pNVar1,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_5 + 7));
  }
  local_148 = "#version 310 es\nshared uint data = 0;";
  compile_compute_shader_helper(pNStack_10,&local_148,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,
               "Compute Shader should not have compiled: shared-qualified variable initialized.",
               (allocator<char> *)((long)&computeShaderSource_6 + 7));
    NegativeTestContext::fail(pNVar1,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_6 + 7));
  }
  local_178 = 
  "#version 310 es\nbuffer SSBO { vec4 data; vec4 moreData[];} ssbo;void test (vec4 data[10]) {}void main (void)\n{\n    test(ssbo.moreData);}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_178,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,
               "Compute Shader should not have compiled: unspecified length buffer member passed as argument to function."
               ,(allocator<char> *)((long)&computeShaderSource_7 + 7));
    NegativeTestContext::fail(pNVar1,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_7 + 7));
  }
  local_1a8 = 
  "#version 310 es\nbuffer SSBO { vec4 data; vec4 moreData[];} ssbo;void main (void)\n{\n    vec4 var = ssbo.moreData[-1];}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_1a8,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,
               "Compute Shader should not have compiled: unspecified length buffer member indexed with negative constant expression."
               ,(allocator<char> *)((long)&computeShaderSource_8 + 7));
    NegativeTestContext::fail(pNVar1,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_8 + 7));
  }
  local_1d8 = 
  "#version 310 es\nlayout(binding=-1) buffer SSBO { vec4 data;};void main (void)\n{\n}\n";
  compile_compute_shader_helper(pNStack_10,&local_1d8,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "Compute Shader should not have compiled: binding point less than zero.",
               (allocator<char> *)((long)&computeShaderSource_9 + 7));
    NegativeTestContext::fail(pNVar1,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_9 + 7));
  }
  local_208 = 
  "#version 310 es\nlayout(binding=1) buffer;layout(binding=2) buffer SSBO { vec4 data;};void main (void)\n{\n}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_208,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,
               "Compute Shader should not have compiled: binding point specified for global scope.",
               (allocator<char> *)((long)&computeShaderSource_10 + 7));
    NegativeTestContext::fail(pNVar1,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_10 + 7));
  }
  local_238 = 
  "#version 310 es\nbuffer SSBO {\tlayout(binding=1) vec4 data;\tlayout(binding=2) vec4 moreData[];} ssbo;void main (void)\n{\n}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_238,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,
               "Compute Shader should not have compiled: binding point specified for block member declarations."
               ,(allocator<char> *)((long)&computeShaderSource_11 + 7));
    NegativeTestContext::fail(pNVar1,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_11 + 7));
  }
  local_268 = 
  "#version 310 es\nreadonly buffer SSBO {vec4 data;} ssbo;void main (void)\n{\nssbo.data = vec4(1, 1, 1, 1);}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_268,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,
               "Compute Shader should not have compiled: writing to buffer block qualified with readonly."
               ,(allocator<char> *)((long)&computeShaderSource_12 + 7));
    NegativeTestContext::fail(pNVar1,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)((long)&computeShaderSource_12 + 7));
  }
  local_298 = 
  "#version 310 es\nwriteonly buffer SSBO {vec4 data;} ssbo;void main (void)\n{\nvec4 var = ssbo.data;}\n"
  ;
  compile_compute_shader_helper(pNStack_10,&local_298,&local_14);
  pNVar1 = pNStack_10;
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,
               "Compute Shader should not have compiled: reading from buffer block qualified with writeonly."
               ,&local_2b9);
    NegativeTestContext::fail(pNVar1,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void compile_compute_shader (NegativeTestContext& ctx)
{
	GLint compileStatus;
	ctx.beginSection("Compile Computer Shader");

	{
		const char* const computeShaderSource		=	"#version 300 es\n"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled with #version 300 es.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data }"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: incorrect SSBO syntax.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data;};"
														"uniform mat4 data;"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: buffer variable redefinition.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data[]; vec4 moreData;};"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: unspecified length buffer member not at the end.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"in vec4 data;"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: input qualifier used.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"shared uint data = 0;";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: shared-qualified variable initialized.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data; vec4 moreData[];} ssbo;"
														"void test (vec4 data[10]) {}"
														"void main (void)\n"
														"{\n"
														"    test(ssbo.moreData);"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: unspecified length buffer member passed as argument to function.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data; vec4 moreData[];} ssbo;"
														"void main (void)\n"
														"{\n"
														"    vec4 var = ssbo.moreData[-1];"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: unspecified length buffer member indexed with negative constant expression.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"layout(binding=-1) buffer SSBO { vec4 data;};"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: binding point less than zero.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"layout(binding=1) buffer;"
														"layout(binding=2) buffer SSBO { vec4 data;};"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: binding point specified for global scope.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO {"
														"	layout(binding=1) vec4 data;"
														"	layout(binding=2) vec4 moreData[];"
														"} ssbo;"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: binding point specified for block member declarations.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"readonly buffer SSBO {vec4 data;} ssbo;"
														"void main (void)\n"
														"{\n"
															"ssbo.data = vec4(1, 1, 1, 1);"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: writing to buffer block qualified with readonly.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"writeonly buffer SSBO {vec4 data;} ssbo;"
														"void main (void)\n"
														"{\n"
															"vec4 var = ssbo.data;"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: reading from buffer block qualified with writeonly.");
	}

	ctx.endSection();
}